

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O3

bool __thiscall
flatbuffers::java::SaveClass
          (java *this,Parser *parser,Definition *def,string *classcode,string *path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  char cVar3;
  long *plVar4;
  long *plVar5;
  size_type *psVar6;
  ulong *puVar7;
  bool bVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> filename;
  string code;
  string name_space_dir;
  string name_space_java;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  undefined1 *local_2c0 [2];
  undefined1 local_2b0 [16];
  char *local_2a0;
  long local_298;
  char local_290 [16];
  Parser *local_280;
  Definition *local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  if ((def->name)._M_string_length == 0) {
    bVar8 = true;
  }
  else {
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    local_270._M_string_length = 0;
    local_270.field_2._M_local_buf[0] = '\0';
    local_2a0 = local_290;
    local_280 = parser;
    local_278 = def;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_2a0,classcode,
               (long)&(path->_M_dataplus)._M_p + (long)&(classcode->_M_dataplus)._M_p);
    puVar7 = *(ulong **)(this + 0x90);
    if (puVar7 != *(ulong **)(this + 0x98)) {
      do {
        if (local_270._M_string_length != 0) {
          std::__cxx11::string::append((char *)&local_270);
          std::__cxx11::string::append((char *)&local_2a0);
        }
        std::__cxx11::string::_M_append((char *)&local_270,*puVar7);
        std::__cxx11::string::_M_append((char *)&local_2a0,*puVar7);
        mkdir(local_2a0,0x1ed);
        puVar7 = puVar7 + 4;
      } while (puVar7 != *(ulong **)(this + 0x98));
    }
    local_2c0[0] = local_2b0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_2c0,"// automatically generated, do not modify\n\n","");
    std::operator+(&local_2e0,"package ",&local_270);
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_2e0);
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_220 = *plVar5;
      lStack_218 = plVar4[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *plVar5;
      local_230 = (long *)*plVar4;
    }
    local_228 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)local_2c0,(ulong)local_230);
    if (local_230 != &local_220) {
      operator_delete(local_230);
    }
    paVar1 = &local_2e0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    std::__cxx11::string::append((char *)local_2c0);
    std::__cxx11::string::append((char *)local_2c0);
    std::__cxx11::string::_M_append((char *)local_2c0,(ulong)(local_278->name)._M_dataplus._M_p);
    local_250[0] = local_240;
    std::__cxx11::string::_M_construct<char*>((string *)local_250,local_2a0,local_2a0 + local_298);
    std::__cxx11::string::append((char *)local_250);
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)local_250,*(ulong *)&(local_280->structs_).dict._M_t._M_impl
                               );
    plVar5 = plVar4 + 2;
    if ((long *)*plVar4 == plVar5) {
      local_220 = *plVar5;
      lStack_218 = plVar4[3];
      local_230 = &local_220;
    }
    else {
      local_220 = *plVar5;
      local_230 = (long *)*plVar4;
    }
    local_228 = plVar4[1];
    *plVar4 = (long)plVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    plVar4 = (long *)std::__cxx11::string::append((char *)&local_230);
    psVar6 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar6) {
      local_2e0.field_2._M_allocated_capacity = *psVar6;
      local_2e0.field_2._8_8_ = plVar4[3];
      local_2e0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_2e0.field_2._M_allocated_capacity = *psVar6;
      local_2e0._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_2e0._M_string_length = plVar4[1];
    *plVar4 = (long)psVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    if (local_230 != &local_220) {
      operator_delete(local_230);
    }
    if (local_250[0] != local_240) {
      operator_delete(local_250[0]);
    }
    puVar2 = local_2c0[0];
    std::ofstream::ofstream(&local_230,local_2e0._M_dataplus._M_p,_S_out);
    cVar3 = std::__basic_file<char>::is_open();
    if (cVar3 == '\0') {
      bVar8 = false;
    }
    else {
      std::ostream::write((char *)&local_230,(long)puVar2);
      bVar8 = (abStack_210[local_230[-3]] & 1) == 0;
    }
    local_230 = _VTT;
    *(undefined8 *)((long)&local_230 + _VTT[-3]) = _memcpy;
    std::filebuf::~filebuf((filebuf *)&local_228);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != paVar1) {
      operator_delete(local_2e0._M_dataplus._M_p);
    }
    if (local_2c0[0] != local_2b0) {
      operator_delete(local_2c0[0]);
    }
    if (local_2a0 != local_290) {
      operator_delete(local_2a0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p);
    }
  }
  return bVar8;
}

Assistant:

static bool SaveClass(const Parser &parser, const Definition &def,
                      const std::string &classcode, const std::string &path) {
  if (!classcode.length()) return true;

  std::string name_space_java;
  std::string name_space_dir = path;
  for (auto it = parser.name_space_.begin();
        it != parser.name_space_.end(); ++it) {
    if (name_space_java.length()) {
      name_space_java += ".";
      name_space_dir += PATH_SEPARATOR;
    }
    name_space_java += *it;
    name_space_dir += *it;
    mkdir(name_space_dir.c_str(), S_IRWXU|S_IRGRP|S_IXGRP|S_IROTH|S_IXOTH);
  }

  std::string code = "// automatically generated, do not modify\n\n";
  code += "package " + name_space_java + ";\n\n";
  code += "import java.nio.*;\nimport java.lang.*;\nimport java.util.*;\n";
  code += "import flatbuffers.*;\n\n";
  code += classcode;
  auto filename = name_space_dir + PATH_SEPARATOR + def.name + ".java";
  return SaveFile(filename.c_str(), code, false);
}